

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  pointer *pppAVar1;
  pointer pcVar2;
  App *this_00;
  element_type *peVar3;
  long *plVar4;
  App **ppAVar5;
  pointer *pppAVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_b0;
  long lStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  pointer *local_50 [2];
  App *local_40 [2];
  
  if (prev->_M_string_length == 0) {
    pppAVar1 = &local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppAVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->name_)._M_string_length);
    ::std::__cxx11::string::operator=((string *)prev,(string *)&local_b0);
    local_40[0] = (App *)local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pppAVar6 = (pointer *)
               local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)pppAVar1) goto LAB_0011e2ed;
  }
  else {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_50[0] = (pointer *)local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->name_)._M_string_length);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x135954);
    pppAVar1 = &local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    ppAVar5 = (App **)(plVar4 + 2);
    if ((App **)*plVar4 == ppAVar5) {
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppAVar5;
      lStack_98 = plVar4[3];
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppAVar1;
    }
    else {
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppAVar5;
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar4;
    }
    local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar4[1];
    *plVar4 = (long)ppAVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)prev,
               (ulong)local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppAVar1) {
      operator_delete(local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)(_func_int ***)
                                    local_b0.
                                    super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    }
    pppAVar6 = local_50[0];
    if ((App **)local_50[0] == local_40) goto LAB_0011e2ed;
  }
  operator_delete(pppAVar6,(ulong)((long)&local_40[0]->_vptr_App + 1));
LAB_0011e2ed:
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_b0,&this->parsed_subcommands_)
  ;
  if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    peVar3 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    paVar8 = &local_80;
    pcVar2 = (prev->_M_dataplus)._M_p;
    local_90[0] = paVar8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar2,pcVar2 + prev->_M_string_length);
    (*peVar3->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar3,this,local_90,(ulong)mode);
    _Var7._M_p = (pointer)local_90[0];
  }
  else {
    this_00 = *local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    paVar8 = &local_70.field_2;
    pcVar2 = (prev->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + prev->_M_string_length);
    help(__return_storage_ptr__,this_00,&local_70,Normal);
    _Var7._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p,paVar8->_M_allocated_capacity + 1);
  }
  if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help(std::string prev = "", AppFormatMode mode = AppFormatMode::Normal) const {
        if(prev.empty())
            prev = get_name();
        else
            prev += " " + get_name();

        // Delegate to subcommand if needed
        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(prev);
        else
            return formatter_->make_help(this, prev, mode);
    }